

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O1

void __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
ClientBase(ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
           *this,string *host_port,unsigned_short default_port)

{
  ScopeRunner *__p;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  parsed_host_port;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  local_50;
  
  this->_vptr_ClientBase = (_func_int **)&PTR__ClientBase_00252b78;
  (this->config).timeout = 0;
  (this->config).timeout_connect = 0;
  (this->config).max_response_streambuf_size = 0xffffffffffffffff;
  (this->config).proxy_server._M_dataplus._M_p = (pointer)&(this->config).proxy_server.field_2;
  (this->config).proxy_server._M_string_length = 0;
  (this->config).proxy_server.field_2._M_local_buf[0] = '\0';
  (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->internal_io_service = false;
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  (this->host)._M_string_length = 0;
  (this->host).field_2._M_local_buf[0] = '\0';
  this->default_port = default_port;
  (this->host_port)._M_t.
  super___uniq_ptr_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (this->connections_mutex).mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->connections_mutex).mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->connections_mutex).mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->connections_mutex).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->connections_mutex).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->connections)._M_h._M_buckets = &(this->connections)._M_h._M_single_bucket;
  (this->connections)._M_h._M_bucket_count = 1;
  (this->connections)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->connections)._M_h._M_element_count = 0;
  (this->connections)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->connections)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->connections)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __p = (ScopeRunner *)operator_new(8);
  (__p->count).super___atomic_base<long>._M_i = 0;
  (this->handler_runner).super___shared_ptr<SimpleWeb::ScopeRunner,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<SimpleWeb::ScopeRunner*>
            (&(this->handler_runner).
              super___shared_ptr<SimpleWeb::ScopeRunner,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p
            );
  *(undefined8 *)
   ((long)&(this->synchronous_request_mutex).mutex.super___mutex_base._M_mutex.__data.__list.__prev
   + 1) = 0;
  *(undefined8 *)
   ((long)&(this->synchronous_request_mutex).mutex.super___mutex_base._M_mutex.__data.__list.__next
   + 1) = 0;
  *(undefined8 *)((long)&(this->synchronous_request_mutex).mutex.super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->synchronous_request_mutex).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->synchronous_request_mutex).mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->synchronous_request_mutex).mutex.super___mutex_base._M_mutex + 8) =
       0;
  parse_host_port(&local_50,this,host_port,default_port);
  std::__cxx11::string::_M_assign((string *)&this->host);
  this->port = local_50.second;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != &local_50.first.field_2) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

ClientBase(const std::string &host_port, unsigned short default_port) noexcept : default_port(default_port), handler_runner(new ScopeRunner()) {
      auto parsed_host_port = parse_host_port(host_port, default_port);
      host = parsed_host_port.first;
      port = parsed_host_port.second;
    }